

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O0

void __thiscall
soplex::SoPlexBase<double>::_optimizeRational(SoPlexBase<double> *this,bool *interrupt)

{
  Status SVar1;
  bool bVar2;
  Verbosity VVar3;
  SPxStatus SVar4;
  SPxBasisBase<double> *this_00;
  SoPlexBase<double> *in_RDI;
  SolRational *sol;
  Real RVar5;
  Verbosity old_verbosity_17;
  Verbosity old_verbosity_16;
  Verbosity old_verbosity_15;
  Verbosity old_verbosity_14;
  Verbosity old_verbosity_13;
  Verbosity old_verbosity_12;
  Verbosity old_verbosity_11;
  Verbosity old_verbosity_10;
  Verbosity old_verbosity_9;
  SolRational solUnbounded_1;
  Verbosity old_verbosity_8;
  Verbosity old_verbosity_7;
  Verbosity old_verbosity_6;
  Verbosity old_verbosity_5;
  Verbosity old_verbosity_4;
  Verbosity old_verbosity_3;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  SolRational solUnbounded;
  bool error;
  bool unbounded;
  bool infeasible;
  bool dualFeasible;
  bool primalFeasible;
  bool stoppedIter;
  bool stoppedTime;
  int oldRatiotester;
  int oldRepresentation;
  Verbosity old_verbosity;
  bool unboundednessNotCertified;
  bool infeasibilityNotCertified;
  bool hasUnboundedRay;
  SoPlexBase<double> *in_stack_000007e0;
  char *in_stack_fffffffffffffc78;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *vec;
  SPxStatus stat;
  SoPlexBase<double> *in_stack_fffffffffffffc80;
  SoPlexBase<double> *this_01;
  SPxLPBase<double> *in_stack_fffffffffffffc88;
  SPxSolverBase<double> *in_stack_fffffffffffffc90;
  VarStatus *in_stack_fffffffffffffc98;
  SPxSolverBase<double> *in_stack_fffffffffffffca0;
  SoPlexBase<double> *in_stack_fffffffffffffcb0;
  bool *in_stack_fffffffffffffcb8;
  SPxSolverBase<double> *pSVar6;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffffcc8;
  SolRational *in_stack_fffffffffffffcd0;
  SoPlexBase<double> *in_stack_fffffffffffffcd8;
  SPxOut *in_stack_fffffffffffffcf0;
  SPxOut *in_stack_fffffffffffffcf8;
  SPxSolverBase<double> *in_stack_fffffffffffffd00;
  SPxOut *in_stack_fffffffffffffd08;
  SPxOut *in_stack_fffffffffffffd10;
  SPxOut *in_stack_fffffffffffffd18;
  bool *in_stack_fffffffffffffd28;
  SoPlexBase<double> *in_stack_fffffffffffffd38;
  undefined1 init;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_stack_fffffffffffffd40;
  SoPlexBase<double> *in_stack_fffffffffffffd48;
  SolRational *in_stack_fffffffffffffd50;
  SoPlexBase<double> *in_stack_fffffffffffffd58;
  Verbosity local_290;
  Verbosity local_28c [3];
  Verbosity local_280;
  Verbosity local_27c [3];
  Verbosity local_270;
  Verbosity local_26c [3];
  Verbosity local_260;
  Verbosity local_25c [3];
  Verbosity local_250;
  Verbosity local_24c [33];
  SolRational *in_stack_fffffffffffffe38;
  SoPlexBase<double> *in_stack_fffffffffffffe40;
  SolRational *in_stack_fffffffffffffe48;
  SoPlexBase<double> *in_stack_fffffffffffffe50;
  byte local_178;
  Verbosity local_168;
  Verbosity local_164 [3];
  Verbosity local_158;
  Verbosity local_154;
  Verbosity in_stack_fffffffffffffeb0;
  Verbosity in_stack_fffffffffffffeb4;
  Verbosity local_148;
  Verbosity local_144 [3];
  Verbosity local_138;
  Verbosity local_134;
  int local_130;
  Verbosity local_12c;
  Verbosity local_128 [63];
  byte local_2b;
  byte local_2a;
  undefined1 local_29 [2];
  byte local_27;
  byte local_26;
  byte local_25;
  int local_24;
  int local_20;
  Verbosity local_1c;
  Verbosity local_18;
  byte local_13;
  byte local_12;
  byte local_11;
  
  local_11 = 0;
  local_12 = 0;
  local_13 = 0;
  (*in_RDI->_statistics->solvingTime->_vptr_Timer[3])();
  (*in_RDI->_statistics->preprocessingTime->_vptr_Timer[3])();
  (*in_RDI->_statistics->initialPrecisionTime->_vptr_Timer[3])();
  in_RDI->_lastSolveMode = 2;
  _resetBoostedPrecision(in_RDI);
  if ((in_RDI->_isRealLPLoaded & 1U) == 0) {
    SPxSolverBase<double>::loadLP
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
               SUB81((ulong)in_stack_fffffffffffffc80 >> 0x38,0));
    spx_free<soplex::SPxLPBase<double>*>((SPxLPBase<double> **)0x457f68);
    in_RDI->_realLP = &(in_RDI->_solver).super_SPxLPBase<double>;
    in_RDI->_isRealLPLoaded = true;
  }
  else if ((in_RDI->_hasBasis & 1U) != 0) {
    in_stack_fffffffffffffd38 = (SoPlexBase<double> *)&in_RDI->_basisStatusRows;
    numRows((SoPlexBase<double> *)0x457fc0);
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
              ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_fffffffffffffc80,
               (int)((ulong)in_stack_fffffffffffffc78 >> 0x20));
    in_stack_fffffffffffffd40 = &in_RDI->_basisStatusCols;
    numCols((SoPlexBase<double> *)0x457fed);
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
              ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_fffffffffffffc80,
               (int)((ulong)in_stack_fffffffffffffc78 >> 0x20));
    in_stack_fffffffffffffd48 = (SoPlexBase<double> *)&in_RDI->_solver;
    in_stack_fffffffffffffd50 =
         (SolRational *)
         DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr(&in_RDI->_basisStatusRows);
    in_stack_fffffffffffffd58 =
         (SoPlexBase<double> *)
         DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr(&in_RDI->_basisStatusCols);
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(&in_RDI->_basisStatusRows);
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::size(&in_RDI->_basisStatusCols);
    SPxSolverBase<double>::getBasis
              (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
               (VarStatus *)in_stack_fffffffffffffc90,
               (int)((ulong)in_stack_fffffffffffffc88 >> 0x20),(int)in_stack_fffffffffffffc88);
  }
  _storeLPReal(in_stack_fffffffffffffc80);
  sol = (SolRational *)realParam(in_RDI,OBJLIMIT_LOWER);
  RVar5 = realParam(in_RDI,INFTY);
  if ((double)sol <= -RVar5) {
    in_stack_fffffffffffffd28 = (bool *)realParam(in_RDI,OBJLIMIT_UPPER);
    RVar5 = realParam(in_RDI,INFTY);
    if (RVar5 <= (double)in_stack_fffffffffffffd28) goto LAB_004581e3;
  }
  if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
     (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 3 < (int)VVar3)) {
    local_18 = SPxOut::getVerbosity(&in_RDI->spxout);
    local_1c = INFO2;
    SPxOut::setVerbosity(&in_RDI->spxout,&local_1c);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    SPxOut::setVerbosity(&in_RDI->spxout,&local_18);
  }
LAB_004581e3:
  pSVar6 = &in_RDI->_solver;
  RVar5 = realParam(in_RDI,INFTY);
  SPxSolverBase<double>::setTerminationValue(pSVar6,RVar5);
  (*in_RDI->_statistics->preprocessingTime->_vptr_Timer[4])();
  bVar2 = boolParam(in_RDI,LIFTING);
  if (bVar2) {
    _lift(in_stack_000007e0);
  }
  local_20 = intParam(in_RDI,REPRESENTATION);
  setIntParam(in_stack_fffffffffffffd48,(IntParam)((ulong)in_stack_fffffffffffffd40 >> 0x20),
              (int)in_stack_fffffffffffffd40,SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0));
  local_24 = intParam(in_RDI,RATIOTESTER);
  if (local_24 == 3) {
    setIntParam(in_stack_fffffffffffffd48,(IntParam)((ulong)in_stack_fffffffffffffd40 >> 0x20),
                (int)in_stack_fffffffffffffd40,SUB81((ulong)in_stack_fffffffffffffd38 >> 0x38,0));
  }
  bVar2 = boolParam(in_RDI,EQTRANS);
  if (bVar2) {
    _transformEquality((SoPlexBase<double> *)
                       CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  }
  in_RDI->_storedBasis = false;
  do {
    local_27 = 0;
    local_29[1] = 0;
    local_29[0] = 0;
    local_2a = 0;
    local_2b = 0;
    local_25 = 0;
    local_26 = 0;
    _switchToStandardMode(in_RDI);
    this_01 = (SoPlexBase<double> *)local_29;
    vec = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)(local_29 + 1);
    _performOptIRWrapper
              (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
               SUB81((ulong)in_stack_fffffffffffffcc8 >> 0x38,0),
               SUB81((ulong)in_stack_fffffffffffffcc8 >> 0x30,0),(int)in_stack_fffffffffffffcc8,
               (bool *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
               (bool *)in_stack_fffffffffffffd00,(bool *)in_stack_fffffffffffffd08,
               (bool *)in_stack_fffffffffffffd10,(bool *)in_stack_fffffffffffffd18,(bool *)pSVar6,
               in_stack_fffffffffffffd28);
    if ((local_2b & 1) != 0) {
      in_RDI->_status = ERROR;
      goto LAB_0045951a;
    }
    if ((local_25 & 1) != 0) {
      in_RDI->_status = ABORT_TIME;
      goto LAB_0045951a;
    }
    if ((local_26 & 1) != 0) {
      in_RDI->_status = ABORT_ITER;
      goto LAB_0045951a;
    }
    if (((local_2a & 1) == 0) || ((local_13 & 1) != 0)) {
      if (((local_29[0] & 1) == 0) || ((local_12 & 1) != 0)) {
        if (((local_27 & 1) == 0) || ((local_29[1] & 1) == 0)) {
          if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
             (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
            local_28c[0] = SPxOut::getVerbosity(&in_RDI->spxout);
            local_290 = INFO1;
            SPxOut::setVerbosity(&in_RDI->spxout,&local_290);
            soplex::operator<<((SPxOut *)this_01,(char *)vec);
            SPxOut::setVerbosity(&in_RDI->spxout,local_28c);
          }
        }
        else {
          if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
             (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
            local_28c[2] = SPxOut::getVerbosity(&in_RDI->spxout);
            local_28c[1] = 3;
            SPxOut::setVerbosity(&in_RDI->spxout,local_28c + 1);
            soplex::operator<<((SPxOut *)this_01,(char *)vec);
            SPxOut::setVerbosity(&in_RDI->spxout,local_28c + 2);
          }
          in_RDI->_status = OPTIMAL;
        }
        goto LAB_0045951a;
      }
      _storeBasis(this_01);
      _switchToFeasMode(in_RDI);
      _performFeasIRStable
                (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                 (bool *)in_stack_fffffffffffffd48,(bool *)in_stack_fffffffffffffd40,
                 (bool *)in_stack_fffffffffffffd38,(bool *)sol);
      if ((local_2b & 1) != 0) {
        if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
           (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
          local_164[0] = SPxOut::getVerbosity(&in_RDI->spxout);
          local_168 = INFO1;
          SPxOut::setVerbosity(&in_RDI->spxout,&local_168);
          soplex::operator<<((SPxOut *)this_01,(char *)vec);
          SPxOut::setVerbosity(&in_RDI->spxout,local_164);
        }
        in_RDI->_status = ERROR;
        _restoreBasis(this_01);
        goto LAB_0045951a;
      }
      local_12 = (local_29[0] ^ 0xff) & 1;
      if ((local_25 & 1) != 0) {
        in_RDI->_status = ABORT_TIME;
        _restoreBasis(this_01);
        goto LAB_0045951a;
      }
      if ((local_26 & 1) != 0) {
        in_RDI->_status = ABORT_ITER;
        _restoreBasis(this_01);
        goto LAB_0045951a;
      }
      if (((local_29[0] & 1) != 0) && (bVar2 = boolParam(in_RDI,TESTDUALINF), bVar2)) {
        SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::SolBase(in_stack_fffffffffffffcc8);
        _switchToUnbdMode(in_RDI);
        _performUnboundedIRStable
                  (in_stack_fffffffffffffd38,sol,in_stack_fffffffffffffd28,(bool *)pSVar6,
                   (bool *)in_stack_fffffffffffffd18,(bool *)in_stack_fffffffffffffd10);
        if ((local_2b & 1) == 0) {
          if ((local_11 & 1) == 0) {
            if ((local_178 >> 2 & 1) == 0) {
              if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
                 (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
                in_stack_fffffffffffffcc8 =
                     (SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)&in_RDI->spxout;
                local_26c[2] = SPxOut::getVerbosity((SPxOut *)in_stack_fffffffffffffcc8);
                local_26c[1] = 3;
                SPxOut::setVerbosity((SPxOut *)in_stack_fffffffffffffcc8,local_26c + 1);
                soplex::operator<<((SPxOut *)this_01,(char *)vec);
                SPxOut::setVerbosity(&in_RDI->spxout,local_26c + 2);
              }
            }
            else {
              if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
                 (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
                in_stack_fffffffffffffcd0 = (SolRational *)&in_RDI->spxout;
                local_25c[0] = SPxOut::getVerbosity((SPxOut *)in_stack_fffffffffffffcd0);
                local_260 = INFO1;
                SPxOut::setVerbosity((SPxOut *)in_stack_fffffffffffffcd0,&local_260);
                soplex::operator<<((SPxOut *)this_01,(char *)vec);
                SPxOut::setVerbosity(&in_RDI->spxout,local_25c);
              }
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                           *)this_01,vec);
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                           *)this_01,vec);
              (in_RDI->_solRational).field_0xd0 = (in_RDI->_solRational).field_0xd0 & 0xfb | 4;
            }
          }
          else {
            if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
               (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
              in_stack_fffffffffffffcd8 = (SoPlexBase<double> *)&in_RDI->spxout;
              local_25c[2] = SPxOut::getVerbosity((SPxOut *)in_stack_fffffffffffffcd8);
              local_25c[1] = 3;
              SPxOut::setVerbosity((SPxOut *)in_stack_fffffffffffffcd8,local_25c + 1);
              soplex::operator<<((SPxOut *)this_01,(char *)vec);
              SPxOut::setVerbosity(&in_RDI->spxout,local_25c + 2);
            }
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         *)this_01,vec);
            (in_RDI->_solRational).field_0xd0 = (in_RDI->_solRational).field_0xd0 & 0xfd | 2;
          }
          local_130 = 0;
        }
        else {
          if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
             (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
            local_24c[0] = SPxOut::getVerbosity(&in_RDI->spxout);
            local_250 = INFO1;
            SPxOut::setVerbosity(&in_RDI->spxout,&local_250);
            soplex::operator<<((SPxOut *)this_01,(char *)vec);
            SPxOut::setVerbosity(&in_RDI->spxout,local_24c);
          }
          in_RDI->_status = ERROR;
          _restoreBasis(this_01);
          local_130 = 2;
        }
        SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::~SolBase((SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)this_01);
        if (local_130 != 0) goto LAB_0045951a;
      }
      _restoreBasis(this_01);
      if ((local_29[0] & 1) != 0) {
        if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
           (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
          local_26c[0] = SPxOut::getVerbosity(&in_RDI->spxout);
          local_270 = INFO1;
          SPxOut::setVerbosity(&in_RDI->spxout,&local_270);
          soplex::operator<<((SPxOut *)this_01,(char *)vec);
          SPxOut::setVerbosity(&in_RDI->spxout,local_26c);
        }
        in_RDI->_status = INFEASIBLE;
        goto LAB_0045951a;
      }
      if ((local_11 & 1) != 0) {
        if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
           (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
          local_27c[2] = SPxOut::getVerbosity(&in_RDI->spxout);
          local_27c[1] = 3;
          SPxOut::setVerbosity(&in_RDI->spxout,local_27c + 1);
          soplex::operator<<((SPxOut *)this_01,(char *)vec);
          SPxOut::setVerbosity(&in_RDI->spxout,local_27c + 2);
        }
        in_RDI->_status = UNBOUNDED;
        goto LAB_0045951a;
      }
      if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
         (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
        local_27c[0] = SPxOut::getVerbosity(&in_RDI->spxout);
        local_280 = INFO1;
        SPxOut::setVerbosity(&in_RDI->spxout,&local_280);
        soplex::operator<<((SPxOut *)this_01,(char *)vec);
        SPxOut::setVerbosity(&in_RDI->spxout,local_27c);
      }
    }
    else {
      SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::SolBase(in_stack_fffffffffffffcc8);
      _switchToUnbdMode(in_RDI);
      _performUnboundedIRStable
                (in_stack_fffffffffffffd38,sol,in_stack_fffffffffffffd28,(bool *)pSVar6,
                 (bool *)in_stack_fffffffffffffd18,(bool *)in_stack_fffffffffffffd10);
      if ((local_2b & 1) == 0) {
        if ((local_11 & 1) == 0) {
          if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
             (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
            in_stack_fffffffffffffd08 = &in_RDI->spxout;
            local_144[2] = SPxOut::getVerbosity(in_stack_fffffffffffffd08);
            local_144[1] = 3;
            SPxOut::setVerbosity(in_stack_fffffffffffffd08,local_144 + 1);
            soplex::operator<<((SPxOut *)this_01,(char *)vec);
            SPxOut::setVerbosity(&in_RDI->spxout,local_144 + 2);
          }
        }
        else if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
                (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
          in_stack_fffffffffffffd10 = &in_RDI->spxout;
          local_134 = SPxOut::getVerbosity(in_stack_fffffffffffffd10);
          local_138 = INFO1;
          SPxOut::setVerbosity(in_stack_fffffffffffffd10,&local_138);
          soplex::operator<<((SPxOut *)this_01,(char *)vec);
          SPxOut::setVerbosity(&in_RDI->spxout,&local_134);
        }
        local_13 = (local_11 ^ 0xff) & 1;
        if ((local_25 & 1) == 0) {
          if ((local_26 & 1) == 0) {
            _switchToFeasMode(in_RDI);
            _performFeasIRStable
                      (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                       (bool *)in_stack_fffffffffffffd48,(bool *)in_stack_fffffffffffffd40,
                       (bool *)in_stack_fffffffffffffd38,(bool *)sol);
            if ((local_11 & 1) != 0) {
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                           *)this_01,vec);
              (in_RDI->_solRational).field_0xd0 = (in_RDI->_solRational).field_0xd0 & 0xfd | 2;
            }
            if ((local_2b & 1) == 0) {
              if ((local_25 & 1) == 0) {
                if ((local_26 & 1) == 0) {
                  if ((local_29[0] & 1) == 0) {
                    if ((local_11 & 1) == 0) {
                      if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
                         (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
                        local_164[2] = SPxOut::getVerbosity(&in_RDI->spxout);
                        local_164[1] = 3;
                        SPxOut::setVerbosity(&in_RDI->spxout,local_164 + 1);
                        soplex::operator<<((SPxOut *)this_01,(char *)vec);
                        SPxOut::setVerbosity(&in_RDI->spxout,local_164 + 2);
                      }
                      local_130 = 3;
                    }
                    else {
                      if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
                         (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
                        in_stack_fffffffffffffcf0 = &in_RDI->spxout;
                        local_154 = SPxOut::getVerbosity(in_stack_fffffffffffffcf0);
                        local_158 = INFO1;
                        SPxOut::setVerbosity(in_stack_fffffffffffffcf0,&local_158);
                        soplex::operator<<((SPxOut *)this_01,(char *)vec);
                        SPxOut::setVerbosity(&in_RDI->spxout,&local_154);
                      }
                      in_RDI->_status = UNBOUNDED;
                      local_130 = 2;
                    }
                  }
                  else {
                    if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
                       (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
                      in_stack_fffffffffffffcf8 = &in_RDI->spxout;
                      SPxOut::getVerbosity(in_stack_fffffffffffffcf8);
                      SPxOut::setVerbosity
                                (in_stack_fffffffffffffcf8,(Verbosity *)&stack0xfffffffffffffeb0);
                      soplex::operator<<((SPxOut *)this_01,(char *)vec);
                      SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)&stack0xfffffffffffffeb4);
                    }
                    in_RDI->_status = INFEASIBLE;
                    local_130 = 2;
                  }
                }
                else {
                  in_RDI->_status = ABORT_ITER;
                  local_130 = 2;
                }
              }
              else {
                in_RDI->_status = ABORT_TIME;
                local_130 = 2;
              }
            }
            else {
              if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
                 (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
                in_stack_fffffffffffffd00 = (SPxSolverBase<double> *)&in_RDI->spxout;
                local_144[0] = SPxOut::getVerbosity((SPxOut *)in_stack_fffffffffffffd00);
                local_148 = INFO1;
                SPxOut::setVerbosity((SPxOut *)in_stack_fffffffffffffd00,&local_148);
                soplex::operator<<((SPxOut *)this_01,(char *)vec);
                SPxOut::setVerbosity(&in_RDI->spxout,local_144);
              }
              in_RDI->_status = ERROR;
              local_130 = 2;
            }
          }
          else {
            in_RDI->_status = ABORT_ITER;
            local_130 = 2;
          }
        }
        else {
          in_RDI->_status = ABORT_TIME;
          local_130 = 2;
        }
      }
      else {
        if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
           (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
          in_stack_fffffffffffffd18 = &in_RDI->spxout;
          local_128[0] = SPxOut::getVerbosity(in_stack_fffffffffffffd18);
          local_12c = INFO1;
          SPxOut::setVerbosity(in_stack_fffffffffffffd18,&local_12c);
          soplex::operator<<((SPxOut *)this_01,(char *)vec);
          SPxOut::setVerbosity(&in_RDI->spxout,local_128);
        }
        in_RDI->_status = ERROR;
        local_130 = 2;
      }
      SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::~SolBase((SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)this_01);
      if (local_130 == 2) goto LAB_0045951a;
    }
    bVar2 = _isSolveStopped((SoPlexBase<double> *)
                            CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                            in_stack_fffffffffffffcb8,(bool *)in_stack_fffffffffffffcb0);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
LAB_0045951a:
      stat = (SPxStatus)((ulong)vec >> 0x20);
      init = (undefined1)((ulong)in_stack_fffffffffffffd38 >> 0x38);
      in_RDI->_switchedToBoosted = false;
      in_RDI->_hasOldBasis = false;
      in_RDI->_hasOldFeasBasis = false;
      in_RDI->_hasOldUnbdBasis = false;
      if (((in_RDI->_status == OPTIMAL) || (in_RDI->_status == INFEASIBLE)) ||
         (in_RDI->_status == UNBOUNDED)) {
        in_RDI->_hasSolRational = true;
      }
      bVar2 = boolParam(in_RDI,EQTRANS);
      if (bVar2) {
        _untransformEquality(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      }
      setIntParam(in_stack_fffffffffffffd48,(IntParam)((ulong)in_stack_fffffffffffffd40 >> 0x20),
                  (int)in_stack_fffffffffffffd40,(bool)init);
      setIntParam(in_stack_fffffffffffffd48,(IntParam)((ulong)in_stack_fffffffffffffd40 >> 0x20),
                  (int)in_stack_fffffffffffffd40,(bool)init);
      bVar2 = boolParam(in_RDI,LIFTING);
      if (bVar2) {
        _project(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      }
      _restoreLPReal(in_stack_fffffffffffffcb0);
      if ((in_RDI->_hasBasis & 1U) != 0) {
        pSVar6 = &in_RDI->_solver;
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_const_ptr
                  (&in_RDI->_basisStatusRows);
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_const_ptr
                  (&in_RDI->_basisStatusCols);
        SPxSolverBase<double>::setBasis
                  (in_stack_fffffffffffffd00,(VarStatus *)in_stack_fffffffffffffcf8,
                   (VarStatus *)in_stack_fffffffffffffcf0);
        this_00 = SPxSolverBase<double>::basis(pSVar6);
        SVar4 = SPxBasisBase<double>::status(this_00);
        in_RDI->_hasBasis = NO_PROBLEM < SVar4;
        SVar1 = in_RDI->_status;
        if (SVar1 == OPTIMAL) {
          SPxSolverBase<double>::setBasisStatus((SPxSolverBase<double> *)this_01,stat);
        }
        else if (SVar1 == UNBOUNDED) {
          SPxSolverBase<double>::setBasisStatus((SPxSolverBase<double> *)this_01,stat);
        }
        else if (SVar1 == INFEASIBLE) {
          SPxSolverBase<double>::setBasisStatus((SPxSolverBase<double> *)this_01,stat);
        }
      }
      (*in_RDI->_statistics->initialPrecisionTime->_vptr_Timer[4])();
      (*in_RDI->_statistics->extendedPrecisionTime->_vptr_Timer[4])();
      (*in_RDI->_statistics->solvingTime->_vptr_Timer[4])();
      return;
    }
  } while( true );
}

Assistant:

void SoPlexBase<R>::_optimizeRational(volatile bool* interrupt)
{
#ifndef SOPLEX_WITH_BOOST
   SPX_MSG_ERROR(std::cerr << "ERROR: rational solve without Boost not defined!" << std::endl;)
   return;
#else
   bool hasUnboundedRay = false;
   bool infeasibilityNotCertified = false;
   bool unboundednessNotCertified = false;

   // start timing
   _statistics->solvingTime->start();
   _statistics->preprocessingTime->start();
   _statistics->initialPrecisionTime->start();

   // remember that last solve was rational
   _lastSolveMode = SOLVEMODE_RATIONAL;
   _resetBoostedPrecision();

   // ensure that the solver has the original problemo
   if(!_isRealLPLoaded)
   {
      assert(_realLP != &_solver);

      _solver.loadLP(*_realLP);
      spx_free(_realLP);
      _realLP = &_solver;
      _isRealLPLoaded = true;
   }
   // during the rational solve, we always store basis information in the basis arrays
   else if(_hasBasis)
   {
      _basisStatusRows.reSize(numRows());
      _basisStatusCols.reSize(numCols());
      _solver.getBasis(_basisStatusRows.get_ptr(), _basisStatusCols.get_ptr(), _basisStatusRows.size(),
                       _basisStatusCols.size());
   }

   // store objective, bounds, and sides of Real LP in case they will be modified during iterative refinement
   _storeLPReal();

   // deactivate objective limit in floating-point solver
   if(realParam(SoPlexBase<R>::OBJLIMIT_LOWER) > -realParam(SoPlexBase<R>::INFTY)
         || realParam(SoPlexBase<R>::OBJLIMIT_UPPER) < realParam(SoPlexBase<R>::INFTY))
   {
      SPX_MSG_INFO2(spxout, spxout << "Deactivating objective limit.\n");
   }

   _solver.setTerminationValue(realParam(SoPlexBase<R>::INFTY));

   _statistics->preprocessingTime->stop();

   // apply lifting to reduce range of nonzero matrix coefficients
   if(boolParam(SoPlexBase<R>::LIFTING))
      _lift();

   // force column representation
   ///@todo implement row objectives with row representation
   int oldRepresentation = intParam(SoPlexBase<R>::REPRESENTATION);
   setIntParam(SoPlexBase<R>::REPRESENTATION, SoPlexBase<R>::REPRESENTATION_COLUMN);

   // force ratio test (avoid bound flipping)
   int oldRatiotester = intParam(SoPlexBase<R>::RATIOTESTER);

   if(oldRatiotester == SoPlexBase<R>::RATIOTESTER_BOUNDFLIPPING)
      setIntParam(SoPlexBase<R>::RATIOTESTER, SoPlexBase<R>::RATIOTESTER_FAST);

   ///@todo implement handling of row objectives in Cplex interface
#ifdef SOPLEX_WITH_CPX
   int oldEqtrans = boolParam(SoPlexBase<R>::EQTRANS);
   setBoolParam(SoPlexBase<R>::EQTRANS, true);
#endif

   // introduce slack variables to transform inequality constraints into equations
   if(boolParam(SoPlexBase<R>::EQTRANS))
      _transformEquality();

   _storedBasis = false;

   bool stoppedTime;
   bool stoppedIter;

   do
   {
      bool primalFeasible = false;
      bool dualFeasible = false;
      bool infeasible = false;
      bool unbounded = false;
      bool error = false;
      stoppedTime = false;
      stoppedIter = false;

      // indicate we are solving the original LP
      _switchToStandardMode();

      /// solve problem with iterative refinement and the right precision
      _performOptIRWrapper(_solRational, !unboundednessNotCertified, !infeasibilityNotCertified, 0,
                           primalFeasible, dualFeasible, infeasible, unbounded, stoppedTime, stoppedIter, error);

#ifdef SOPLEX_WITH_MPFR

      // case: an unrecoverable error occured, and precision boosting has reached its limit
      if(error && _boostingLimitReached)
      {
         _status = SPxSolverBase<R>::ERROR;
         break;
      }
      // case: an error occured, boost precision
      else if(error)
#else

      // case: an unrecoverable error occured, boost precision
      if(error)
#endif
      {
         _status = SPxSolverBase<R>::ERROR;
#ifdef SOPLEX_WITH_MPFR

         if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
         {
            if(_setupBoostedSolverAfterRecovery())
               continue;
            else // precision boosting has reached its limit
               break;
         }
         else
            break;

#else
         break;
#endif
      }
      // case: stopped due to some limit
      else if(stoppedTime)
      {
         _status = SPxSolverBase<R>::ABORT_TIME;
         break;
      }
      else if(stoppedIter)
      {
         _status = SPxSolverBase<R>::ABORT_ITER;
         break;
      }
      // case: unboundedness detected for the first time
      else if(unbounded && !unboundednessNotCertified)
      {
         SolRational solUnbounded;

         // indicate we are testing unboundedness
         _switchToUnbdMode();

         _performUnboundedIRStable(solUnbounded, hasUnboundedRay, stoppedTime, stoppedIter, error);

         assert(!hasUnboundedRay || solUnbounded.hasPrimalRay());
         assert(!solUnbounded.hasPrimalRay() || hasUnboundedRay);

         if(error)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error while testing for unboundedness.\n");
            _status = SPxSolverBase<R>::ERROR;
#ifdef SOPLEX_WITH_MPFR

            if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
            {
               if(_setupBoostedSolverAfterRecovery())
                  continue;
               else // precision boosting has reached its limit
                  break;
            }
            else
               break;

#else
            break;
#endif
         }

         if(hasUnboundedRay)
         {
            SPX_MSG_INFO1(spxout, spxout << "Dual infeasible.  Primal unbounded ray available.\n");
         }
         else
         {
            SPX_MSG_INFO1(spxout, spxout << "Dual feasible.  Rejecting primal unboundedness.\n");
         }

         unboundednessNotCertified = !hasUnboundedRay;

         if(stoppedTime)
         {
            _status = SPxSolverBase<R>::ABORT_TIME;
            break;
         }
         else if(stoppedIter)
         {
            _status = SPxSolverBase<R>::ABORT_ITER;
            break;
         }

         // indicate we are testing feasibility
         _switchToFeasMode();

         _performFeasIRStable(_solRational, infeasible, stoppedTime, stoppedIter, error);

         ///@todo this should be stored already earlier, possible switch use solRational above and solFeas here
         if(hasUnboundedRay)
         {
            _solRational._primalRay = solUnbounded._primalRay;
            _solRational._hasPrimalRay = true;
         }

         if(error)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error while testing for feasibility.\n");
            _status = SPxSolverBase<R>::ERROR;
#ifdef SOPLEX_WITH_MPFR

            if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
            {
               if(_setupBoostedSolverAfterRecovery())
                  continue;
               else // precision boosting has reached its limit
                  break;
            }
            else
               break;

#else
            break;
#endif
         }
         else if(stoppedTime)
         {
            _status = SPxSolverBase<R>::ABORT_TIME;
            break;
         }
         else if(stoppedIter)
         {
            _status = SPxSolverBase<R>::ABORT_ITER;
            break;
         }
         else if(infeasible)
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal infeasible.  Dual Farkas ray available.\n");
            _status = SPxSolverBase<R>::INFEASIBLE;
            break;
         }
         else if(hasUnboundedRay)
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal feasible and unbounded.\n");
            _status = SPxSolverBase<R>::UNBOUNDED;
            break;
         }
         else
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal feasible and bounded.\n");
#ifdef SOPLEX_WITH_MPFR

            if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
            {
               if(_setupBoostedSolverAfterRecovery())
                  continue;
               else // precision boosting has reached its limit
                  break;
            }

#endif
            continue;
         }
      }
      // case: infeasibility detected
      else if(infeasible && !infeasibilityNotCertified)
      {
         _storeBasis();

         // indicate we are testing feasibility
         _switchToFeasMode();

         _performFeasIRStable(_solRational, infeasible, stoppedTime, stoppedIter, error);

         if(error)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error while testing for infeasibility.\n");
            _status = SPxSolverBase<R>::ERROR;
            _restoreBasis();
#ifdef SOPLEX_WITH_MPFR

            if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
            {
               if(_setupBoostedSolverAfterRecovery())
                  continue;
               else // precision boosting has reached its limit
                  break;
            }
            else
               break;

#else
            break;
#endif
         }

         infeasibilityNotCertified = !infeasible;

         if(stoppedTime)
         {
            _status = SPxSolverBase<R>::ABORT_TIME;
            _restoreBasis();
            break;
         }
         else if(stoppedIter)
         {
            _status = SPxSolverBase<R>::ABORT_ITER;
            _restoreBasis();
            break;
         }

         if(infeasible && boolParam(SoPlexBase<R>::TESTDUALINF))
         {
            SolRational solUnbounded;

            // indicate we are testing unboundedness
            // not sure about this.
            _switchToUnbdMode();

            _performUnboundedIRStable(solUnbounded, hasUnboundedRay, stoppedTime, stoppedIter, error);

            assert(!hasUnboundedRay || solUnbounded.hasPrimalRay());
            assert(!solUnbounded.hasPrimalRay() || hasUnboundedRay);

            if(error)
            {
               SPX_MSG_INFO1(spxout, spxout << "Error while testing for dual infeasibility.\n");
               _status = SPxSolverBase<R>::ERROR;
               _restoreBasis();
#ifdef SOPLEX_WITH_MPFR

               if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
               {
                  if(_setupBoostedSolverAfterRecovery())
                     continue;
                  else // precision boosting has reached its limit
                     break;
               }
               else
                  break;

#else
               break;
#endif
            }

            if(hasUnboundedRay)
            {
               SPX_MSG_INFO1(spxout, spxout << "Dual infeasible.  Primal unbounded ray available.\n");
               _solRational._primalRay = solUnbounded._primalRay;
               _solRational._hasPrimalRay = true;
            }
            else if(solUnbounded._isDualFeasible)
            {
               SPX_MSG_INFO1(spxout, spxout << "Dual feasible.  Storing dual multipliers.\n");
               _solRational._dual = solUnbounded._dual;
               _solRational._redCost = solUnbounded._redCost;
               _solRational._isDualFeasible = true;
            }
            else
            {
               assert(false);
               SPX_MSG_INFO1(spxout, spxout << "Not dual infeasible.\n");
            }
         }

         _restoreBasis();

         if(infeasible)
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal infeasible.  Dual Farkas ray available.\n");
            _status = SPxSolverBase<R>::INFEASIBLE;
            break;
         }
         else if(hasUnboundedRay)
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal feasible and unbounded.\n");
            _status = SPxSolverBase<R>::UNBOUNDED;
            break;
         }
         else
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal feasible.  Optimizing again.\n");
#ifdef SOPLEX_WITH_MPFR

            if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
            {
               if(_setupBoostedSolverAfterRecovery())
                  continue;
               else // precision boosting has reached its limit
                  break;
            }

#endif
            continue;
         }
      }
      else if(primalFeasible && dualFeasible)
      {
         SPX_MSG_INFO1(spxout, spxout << "Solved to optimality.\n");
         _status = SPxSolverBase<R>::OPTIMAL;
         break;
      }
      else
      {
#ifdef SOPLEX_WITH_MPFR

         if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
         {
            if(_setupBoostedSolverAfterRecovery())
               continue;
            else // precision boosting has reached its limit
               break;
         }
         else
         {
            SPX_MSG_INFO1(spxout, spxout << "Terminating without success.\n");
            break;
         }

#else
         SPX_MSG_INFO1(spxout, spxout << "Terminating without success.\n");
         break;
#endif
      }
   }
   while(!_isSolveStopped(stoppedTime, stoppedIter));

   // reset old basis flags for future optimization runs
   _switchedToBoosted = false;
   _hasOldBasis = false;
   _hasOldFeasBasis = false;
   _hasOldUnbdBasis = false;

   ///@todo set status to ABORT_VALUE if optimal solution exceeds objective limit

   if(_status == SPxSolverBase<R>::OPTIMAL || _status == SPxSolverBase<R>::INFEASIBLE
         || _status == SPxSolverBase<R>::UNBOUNDED)
      _hasSolRational = true;

   // restore original problem
   if(boolParam(SoPlexBase<R>::EQTRANS))
      _untransformEquality(_solRational);

#ifdef SOPLEX_WITH_CPX
   setBoolParam(SoPlexBase<R>::EQTRANS, oldEqtrans);
#endif

   // reset representation and ratio test
   setIntParam(SoPlexBase<R>::REPRESENTATION, oldRepresentation);
   setIntParam(SoPlexBase<R>::RATIOTESTER, oldRatiotester);

   // undo lifting
   if(boolParam(SoPlexBase<R>::LIFTING))
      _project(_solRational);

   // restore objective, bounds, and sides of Real LP in case they have been modified during iterative refinement
   _restoreLPReal();

   // since the Real LP is loaded in the solver, we need to also pass the basis information to the solver if
   // available
   if(_hasBasis)
   {
      assert(_isRealLPLoaded);
      _solver.setBasis(_basisStatusRows.get_const_ptr(), _basisStatusCols.get_const_ptr());
      _hasBasis = (_solver.basis().status() > SPxBasisBase<R>::NO_PROBLEM);

      // since setBasis always sets the basis status to regular, we need to set it manually here
      switch(_status)
      {
      case SPxSolverBase<R>::OPTIMAL:
         _solver.setBasisStatus(SPxBasisBase<R>::OPTIMAL);
         break;

      case SPxSolverBase<R>::INFEASIBLE:
         _solver.setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
         break;

      case SPxSolverBase<R>::UNBOUNDED:
         _solver.setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
         break;

      default:
         break;
      }

   }

   // stop timing
   _statistics->initialPrecisionTime->stop();
   _statistics->extendedPrecisionTime->stop();
   _statistics->solvingTime->stop();
#endif
}

/// perform iterative refinement using the right precision
template <class R>
void SoPlexBase<R>::_performOptIRWrapper(
   SolRational& sol,
   bool acceptUnbounded,
   bool acceptInfeasible,
   int minIRRoundsRemaining,
   bool& primalFeasible,
   bool& dualFeasible,
   bool& infeasible,
   bool& unbounded,
   bool& stoppedTime,
   bool& stoppedIter,
   bool& error
)
{
   _solver.setSolvingForBoosted(boolParam(SoPlexBase<R>::PRECISION_BOOSTING));
   _boostedSolver.setSolvingForBoosted(boolParam(SoPlexBase<R>::PRECISION_BOOSTING));

#ifdef SOPLEX_WITH_MPFR

   if(boolParam(SoPlexBase<R>::ITERATIVE_REFINEMENT))
   {
      // no precision boosting or initial precision -> solve with plain iterative refinement
      if(!boolParam(SoPlexBase<R>::PRECISION_BOOSTING) || !_switchedToBoosted)
      {
         _performOptIRStable(sol, acceptUnbounded, acceptInfeasible, minIRRoundsRemaining,
                             primalFeasible, dualFeasible, infeasible, unbounded, stoppedTime, stoppedIter, error);
      }
      else
      {
         do
         {
            // setup boosted solver for the new iteration
            _setupBoostedSolver();
            // solve problem with iterative refinement and recovery mechanism, using multiprecision
            // return false if a new boosted iteration is needed, true otherwise
            bool needNewBoostedIt;
            _performOptIRStableBoosted(sol, acceptUnbounded, acceptInfeasible, minIRRoundsRemaining,
                                       primalFeasible, dualFeasible, infeasible, unbounded, stoppedTime, stoppedIter, error,
                                       needNewBoostedIt);

            // update statistics for precision boosting
            _updateBoostingStatistics();

            // boost precision if no success
            if(needNewBoostedIt)
            {
               if(!_boostPrecision())
               {
                  // error message already displayed
                  error = true;
                  break;
               }
            }
            else
               break;
         }
         while(true);
      }